

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

ssize_t __thiscall
spdlog::details::file_helper::write(file_helper *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  undefined4 in_register_00000034;
  char *data;
  size_t msg_size;
  filename_t *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int last_errno;
  string *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [64];
  char *local_20;
  size_t local_18;
  buffer<char> *local_10;
  file_helper *local_8;
  
  local_10 = (buffer<char> *)CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  local_18 = ::fmt::v8::detail::buffer<char>::size(local_10);
  local_20 = ::fmt::v8::detail::buffer<char>::data(local_10);
  sVar1 = fwrite(local_20,1,local_18,(FILE *)this->fd_);
  if (sVar1 != local_18) {
    __rhs = local_60;
    os::filename_to_str(in_stack_ffffffffffffff78);
    std::operator+((char *)this,__rhs);
    last_errno = (int)((ulong)this >> 0x20);
    __errno_location();
    throw_spdlog_ex(in_stack_ffffffffffffff90,last_errno);
  }
  return sVar1;
}

Assistant:

SPDLOG_INLINE void file_helper::write(const memory_buf_t &buf)
{
    size_t msg_size = buf.size();
    auto data = buf.data();
    if (std::fwrite(data, 1, msg_size, fd_) != msg_size)
    {
        throw_spdlog_ex("Failed writing to file " + os::filename_to_str(filename_), errno);
    }
}